

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkIsAcyclic_rec(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  uint uVar6;
  char *__format;
  FILE *pFVar7;
  long lVar8;
  
  uVar3 = *(uint *)&pNode->field_0x14;
  uVar6 = uVar3 & 0xf;
  iVar2 = 1;
  if ((uVar6 != 2) && (uVar6 != 5)) {
    if (uVar6 == 6) {
      __assert_fail("!Abc_ObjIsNet(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x5ff,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
    }
    if (uVar6 != 10 && (uVar3 & 0xe) != 8) {
      pAVar1 = pNode->pNtk;
      if (pAVar1->ntkType == ABC_NTK_STRASH) {
        iVar2 = Abc_AigNodeIsConst(pNode);
        if (iVar2 != 0) {
          return 1;
        }
        uVar3 = *(uint *)&pNode->field_0x14;
      }
      if ((uVar3 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x602,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
      }
      iVar2 = Abc_NodeIsTravIdPrevious(pNode);
      if (iVar2 != 0) {
        __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x604,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
      }
      iVar2 = Abc_NodeIsTravIdCurrent(pNode);
      if (iVar2 == 0) {
        Abc_NodeSetTravIdCurrent(pNode);
        for (lVar8 = 0; pAVar1 = pNode->pNtk, lVar8 < (pNode->vFanins).nSize; lVar8 = lVar8 + 1) {
          pAVar5 = Abc_ObjFanin0Ntk((Abc_Obj_t *)
                                    pAVar1->vObjs->pArray[(pNode->vFanins).pArray[lVar8]]);
          if (pAVar5->pNtk != pAVar1) {
            __assert_fail("pFanin->pNtk == pNode->pNtk",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                          ,0x613,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
          }
          iVar2 = Abc_NodeIsTravIdPrevious(pAVar5);
          if ((iVar2 == 0) && (iVar2 = Abc_NtkIsAcyclic_rec(pAVar5), pFVar7 = _stdout, iVar2 == 0))
          {
            pcVar4 = Abc_ObjName(pAVar5);
            __format = " %s ->";
            goto LAB_006aad89;
          }
        }
        if ((pAVar1->ntkType != ABC_NTK_STRASH) ||
           (iVar2 = Abc_AigNodeIsChoice(pNode), pAVar5 = pNode, iVar2 == 0)) {
LAB_006aae6d:
          Abc_NodeSetTravIdPrevious(pNode);
          return 1;
        }
        do {
          pAVar5 = (Abc_Obj_t *)(pAVar5->field_5).pData;
          if (pAVar5 == (Abc_Obj_t *)0x0) goto LAB_006aae6d;
          iVar2 = Abc_NodeIsTravIdPrevious(pAVar5);
        } while ((iVar2 != 0) ||
                (iVar2 = Abc_NtkIsAcyclic_rec(pAVar5), pFVar7 = _stdout, iVar2 != 0));
        pcVar4 = Abc_ObjName(pAVar5);
        fprintf(pFVar7," %s",pcVar4);
        pFVar7 = _stdout;
        pcVar4 = Abc_ObjName(pNode);
        __format = " (choice of %s) -> ";
      }
      else {
        fprintf(_stdout,"Network \"%s\" contains combinational loop!\n",pAVar1->pName);
        pFVar7 = _stdout;
        pcVar4 = Abc_ObjName(pNode);
        __format = "Node \"%s\" is encountered twice on the following path to the COs:\n";
      }
LAB_006aad89:
      iVar2 = 0;
      fprintf(pFVar7,__format,pcVar4);
    }
  }
  return iVar2;
}

Assistant:

int Abc_NtkIsAcyclic_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsCi(pNode) || Abc_ObjIsBox(pNode) || (Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsConst(pNode)) )
        return 1;
    assert( Abc_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        // make sure there is no mixing of networks
        assert( pFanin->pNtk == pNode->pNtk );
        // check if the fanin is visited
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName(pFanin) );
        return 0;
    }
    // visit choices
    if ( Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsChoice(pNode) )
    {
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            // check if the fanin is visited
            if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
                continue;
            // return as soon as the loop is detected
            fprintf( stdout, " %s", Abc_ObjName(pFanin) );
            fprintf( stdout, " (choice of %s) -> ", Abc_ObjName(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}